

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::ValueType::MergeFrom(ValueType *this,ValueType *from)

{
  ulong uVar1;
  LogMessage *other;
  TensorType *pTVar2;
  StateType *pSVar3;
  TupleType *pTVar4;
  DictionaryType *pDVar5;
  ListType *pLVar6;
  undefined1 *puVar7;
  Arena *pAVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0xcd8);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    if (this->_oneof_case_[0] != 1) {
      clear_type(this);
      this->_oneof_case_[0] = 1;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pTVar2 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::TensorType>(pAVar8);
      (this->type_).tensortype_ = pTVar2;
    }
    if (from->_oneof_case_[0] == 1) {
      puVar7 = (undefined1 *)(from->type_).tensortype_;
    }
    else {
      puVar7 = _TensorType_default_instance_;
    }
    TensorType::MergeFrom((this->type_).tensortype_,(TensorType *)puVar7);
    break;
  case 2:
    if (this->_oneof_case_[0] != 2) {
      clear_type(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pLVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::ListType>
                         (pAVar8);
      (this->type_).listtype_ = pLVar6;
    }
    if (from->_oneof_case_[0] == 2) {
      puVar7 = (undefined1 *)(from->type_).listtype_;
    }
    else {
      puVar7 = _ListType_default_instance_;
    }
    ListType::MergeFrom((this->type_).listtype_,(ListType *)puVar7);
    break;
  case 3:
    if (this->_oneof_case_[0] != 3) {
      clear_type(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pTVar4 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::TupleType>(pAVar8);
      (this->type_).tupletype_ = pTVar4;
    }
    if (from->_oneof_case_[0] == 3) {
      puVar7 = (undefined1 *)(from->type_).tupletype_;
    }
    else {
      puVar7 = _TupleType_default_instance_;
    }
    TupleType::MergeFrom((this->type_).tupletype_,(TupleType *)puVar7);
    break;
  case 4:
    if (this->_oneof_case_[0] != 4) {
      clear_type(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pDVar5 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::DictionaryType>(pAVar8);
      (this->type_).dictionarytype_ = pDVar5;
    }
    if (from->_oneof_case_[0] == 4) {
      puVar7 = (undefined1 *)(from->type_).dictionarytype_;
    }
    else {
      puVar7 = _DictionaryType_default_instance_;
    }
    DictionaryType::MergeFrom((this->type_).dictionarytype_,(DictionaryType *)puVar7);
    break;
  case 5:
    if (this->_oneof_case_[0] != 5) {
      clear_type(this);
      this->_oneof_case_[0] = 5;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pSVar3 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::StateType>(pAVar8);
      (this->type_).statetype_ = pSVar3;
    }
    if (from->_oneof_case_[0] == 5) {
      puVar7 = (undefined1 *)(from->type_).statetype_;
    }
    else {
      puVar7 = _StateType_default_instance_;
    }
    StateType::MergeFrom((this->type_).statetype_,(StateType *)puVar7);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ValueType::MergeFrom(const ValueType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.ValueType)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.type_case()) {
    case kTensorType: {
      _internal_mutable_tensortype()->::CoreML::Specification::MILSpec::TensorType::MergeFrom(from._internal_tensortype());
      break;
    }
    case kListType: {
      _internal_mutable_listtype()->::CoreML::Specification::MILSpec::ListType::MergeFrom(from._internal_listtype());
      break;
    }
    case kTupleType: {
      _internal_mutable_tupletype()->::CoreML::Specification::MILSpec::TupleType::MergeFrom(from._internal_tupletype());
      break;
    }
    case kDictionaryType: {
      _internal_mutable_dictionarytype()->::CoreML::Specification::MILSpec::DictionaryType::MergeFrom(from._internal_dictionarytype());
      break;
    }
    case kStateType: {
      _internal_mutable_statetype()->::CoreML::Specification::MILSpec::StateType::MergeFrom(from._internal_statetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}